

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

bool __thiscall
helics::BrokerBase::sendToLogger
          (BrokerBase *this,GlobalFederateId federateID,int logLevel,string_view name,
          string_view message,bool fromRemote)

{
  double dVar1;
  bool bVar2;
  string *psVar3;
  size_type __len2;
  long lVar4;
  char *__s;
  undefined7 in_register_00000089;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  string_view header_00;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  double local_b8 [2];
  string local_a8;
  string local_88;
  char *local_68;
  size_type local_60;
  BaseType local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  size_type sStack_40;
  
  aVar5._1_7_ = in_register_00000089;
  aVar5._0_1_ = fromRemote;
  __s = name._M_str;
  __len2 = name._M_len;
  if (((this->global_id)._M_i.gid == federateID.gid) && ((__len2 == 0 || (__s[__len2 - 1] != ']'))))
  {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_d8._M_string_length = 0;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    (*this->_vptr_BrokerBase[9])(this);
    lVar4 = -0x7fffffffffffffff;
    if (-9223372036.854765 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) &&
        (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != -9223372036.854765) {
      if (9223372036.854765 < (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) ||
          (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) == 9223372036.854765) {
        lVar4 = 0x7fffffffffffffff;
      }
      else {
        dVar1 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) * 1000000000.0;
        lVar4 = (long)(dVar1 + *(double *)(&DAT_003dd040 + (ulong)(0.0 <= dVar1) * 8));
      }
    }
    if (lVar4 + 0x8000000000000001U < 0x7fffa62ce68c1002) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_f8,'[');
      psVar3 = brokerStateName_abi_cxx11_((this->brokerState)._M_i);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append(&local_f8,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_f8,']');
    }
    else {
      local_b8[0] = (double)(lVar4 % 1000000000) * 1e-09 + (double)(lVar4 / 1000000000);
      fmt.size_ = 10;
      fmt.data_ = (char *)0x6;
      args.field_1.values_ = aVar5.values_;
      args.desc_ = (unsigned_long_long)local_b8;
      ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"[t={}]",fmt,args);
      sendToLogger();
    }
    local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_f8._M_dataplus._M_p;
    sStack_40 = local_f8._M_string_length;
    fmt_00.size_ = 0xd1d;
    fmt_00.data_ = (char *)0x9;
    args_00.field_1.args_ = aVar5.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    local_68 = __s;
    local_60 = __len2;
    local_58 = federateID.gid;
    ::fmt::v11::vformat_abi_cxx11_(&local_a8,(v11 *)"{} ({}){}",fmt_00,args_00);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_d8._M_string_length = 0;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_d8,0,0,__s,__len2);
  }
  header_00._M_str = local_d8._M_dataplus._M_p;
  header_00._M_len = local_d8._M_string_length;
  bVar2 = LogManager::sendToLogger
                    ((this->mLogManager).
                     super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     logLevel,header_00,message,fromRemote);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool BrokerBase::sendToLogger(GlobalFederateId federateID,
                              int logLevel,
                              std::string_view name,
                              std::string_view message,
                              bool fromRemote) const
{
    const bool noID = (federateID != global_id.load()) || (!name.empty() && name.back() == ']');

    std::string header;
    if (noID) {
        header = name;
    } else {
        std::string timeString;

        const Time currentTime = getSimulationTime();
        if (currentTime <= mInvalidSimulationTime || currentTime >= cHelicsBigNumber) {
            timeString.push_back('[');
            timeString.append(brokerStateName(getBrokerState()));
            timeString.push_back(']');
        } else {
            timeString = fmt::format("[t={}]", static_cast<double>(currentTime));
        }
        header = fmt::format("{} ({}){}", name, federateID.baseValue(), timeString);
    }
    return mLogManager->sendToLogger(logLevel, header, message, fromRemote);
}